

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslParseables.cpp
# Opt level: O2

char * anon_unknown.dwarf_d185c1::NthArg(char *arg,int n)

{
  char cVar1;
  int x;
  int iVar2;
  
  iVar2 = 0;
  while ((iVar2 < n && (arg != (char *)0x0))) {
    for (; (cVar1 = *arg, cVar1 != '\0' && (cVar1 != ',')); arg = arg + 1) {
    }
    if (cVar1 == '\0') {
      arg = (char *)0x0;
    }
    arg = arg + 1;
    if (cVar1 == '\0') {
      arg = (char *)0x0;
    }
    iVar2 = iVar2 + 1;
  }
  return arg;
}

Assistant:

inline const char* NthArg(const char* arg, int n)
{
    for (int x=0; x<n && arg; ++x)
        if ((arg = FindEndOfArg(arg)) != nullptr)
            ++arg;  // skip arg separator

    return arg;
}